

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::GetLETRecombinationProbability(LArNEST *this,double LET,double efield)

{
  double dVar1;
  LArNEST *local_48;
  double recombProb;
  double DokeBirksB;
  double DokeBirksC;
  double DokeBirksA;
  double efield_local;
  double LET_local;
  LArNEST *this_local;
  
  if ((this->fUseDokeBirks & 1U) == 0) {
    this_local = (LArNEST *)0x0;
  }
  else {
    dVar1 = pow(efield / 1000.0,-0.85);
    DokeBirksC = dVar1 * 0.07;
    DokeBirksB = 0.0;
    if ((efield == 0.0) && (!NAN(efield))) {
      DokeBirksC = 0.0003;
      DokeBirksB = 0.75;
    }
    local_48 = (LArNEST *)
               ((DokeBirksC * LET) / ((DokeBirksC / (1.0 - DokeBirksB)) * LET + 1.0) + DokeBirksB);
    if ((double)local_48 < 0.0) {
      local_48 = (LArNEST *)0x0;
    }
    if (1.0 < (double)local_48) {
      local_48 = (LArNEST *)0x3ff0000000000000;
    }
    this_local = local_48;
  }
  return (double)this_local;
}

Assistant:

double LArNEST::GetLETRecombinationProbability(double LET, double efield) {
  if (fUseDokeBirks) {
    // set up DokeBirks coefficients
    double DokeBirksA = 0.07 * pow((efield / 1.0e3), -0.85);
    double DokeBirksC = 0.00;
    if (efield == 0.0) {
      DokeBirksA = 0.0003;
      DokeBirksC = 0.75;
    }
    // B=A/(1-C) (see paper)
    double DokeBirksB = DokeBirksA / (1 - DokeBirksC);
    double recombProb =
        (DokeBirksA * LET) / (1 + DokeBirksB * LET) + DokeBirksC;

    // check against unphysicality resulting from rounding errors
    if (recombProb < 0.0) {
      recombProb = 0.0;
    }
    if (recombProb > 1.0) {
      recombProb = 1.0;
    }
    return recombProb;
  } else {
    return 0;
  }
}